

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_compressStream_generic
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_inBuffer input_00;
  int iVar1;
  uint uVar2;
  int in_ECX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  syncPoint_t sVar3;
  size_t unaff_retaddr;
  size_t remainingToFlush;
  size_t err_code;
  size_t jobSize;
  syncPoint_t syncPoint;
  uint forwardInputProgress;
  size_t local_58;
  size_t in_stack_ffffffffffffffb8;
  ZSTD_outBuffer *in_stack_ffffffffffffffc0;
  ZSTDMT_CCtx *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_24;
  undefined8 in_stack_fffffffffffffff8;
  
  if (*(ulong *)(in_RSI + 8) < *(ulong *)(in_RSI + 0x10)) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8bf4,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if ((ulong)in_RDX[1] < (ulong)in_RDX[2]) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8bf5,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if ((*(int *)(in_RDI + 0xbbc) == 0) || (in_ECX != 0)) {
    local_24 = in_ECX;
    if ((*(int *)(in_RDI + 0x108) == 0) && ((ulong)in_RDX[2] < (ulong)in_RDX[1])) {
      if (*(long *)(in_RDI + 0x120) == 0) {
        if (*(long *)(in_RDI + 0x130) != 0) {
          __assert_fail("mtctx->inBuff.filled == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8c00,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        iVar1 = ZSTDMT_tryGetInputRange(in_stack_ffffffffffffffc8);
        if ((iVar1 == 0) && (*(int *)(in_RDI + 0xbb4) == *(int *)(in_RDI + 3000))) {
          __assert_fail("mtctx->doneJobID != mtctx->nextJobID",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8c06,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
      }
      if (*(long *)(in_RDI + 0x120) != 0) {
        input_00.size = in_stack_fffffffffffffff8;
        input_00.src = (void *)in_RDI;
        input_00.pos = unaff_retaddr;
        sVar3 = findSynchronizationPoint
                          ((ZSTDMT_CCtx *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),input_00);
        in_stack_ffffffffffffffc8 = (ZSTDMT_CCtx *)sVar3.toLoad;
        if ((sVar3.flush != 0) && (in_ECX == 0)) {
          local_24 = 1;
        }
        if (*(ulong *)(in_RDI + 0x128) < *(ulong *)(in_RDI + 0xf8)) {
          __assert_fail("mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8c0f,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        memcpy((void *)(*(long *)(in_RDI + 0x120) + *(long *)(in_RDI + 0x130)),
               (void *)(*in_RDX + in_RDX[2]),(size_t)in_stack_ffffffffffffffc8);
        in_RDX[2] = (long)&in_stack_ffffffffffffffc8->factory + in_RDX[2];
        *(long *)(in_RDI + 0x130) =
             (long)&in_stack_ffffffffffffffc8->factory + *(long *)(in_RDI + 0x130);
      }
    }
    if (((ulong)in_RDX[2] < (ulong)in_RDX[1]) && (local_24 == 2)) {
      if ((*(long *)(in_RDI + 0x130) != 0) &&
         ((*(long *)(in_RDI + 0x130) != *(long *)(in_RDI + 0xf8) && (*(int *)(in_RDI + 0x84) == 0)))
         ) {
        __assert_fail("mtctx->inBuff.filled == 0 || mtctx->inBuff.filled == mtctx->targetSectionSize || mtctx->params.rsyncable"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8c1f,
                      "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      local_24 = 1;
    }
    if ((((*(int *)(in_RDI + 0x108) != 0) ||
         (*(ulong *)(in_RDI + 0xf8) <= *(ulong *)(in_RDI + 0x130))) ||
        ((local_24 != 0 && (*(long *)(in_RDI + 0x130) != 0)))) ||
       ((local_24 == 2 && (*(int *)(in_RDI + 0xbbc) == 0)))) {
      in_stack_ffffffffffffffc0 = *(ZSTD_outBuffer **)(in_RDI + 0x130);
      if (*(ulong *)(in_RDI + 0xf8) < *(ulong *)(in_RDI + 0x130)) {
        __assert_fail("mtctx->inBuff.filled <= mtctx->targetSectionSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8c28,
                      "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      in_stack_ffffffffffffffb8 =
           ZSTDMT_createCompressionJob
                     (in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0,
                      (ZSTD_EndDirective)(in_stack_ffffffffffffffb8 >> 0x20));
      uVar2 = ERR_isError(in_stack_ffffffffffffffb8);
      if (uVar2 != 0) {
        return in_stack_ffffffffffffffb8;
      }
    }
    local_58 = ZSTDMT_flushProduced
                         (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                          (uint)(in_stack_ffffffffffffffb8 >> 0x20),
                          (ZSTD_EndDirective)in_stack_ffffffffffffffb8);
    if (((ulong)in_RDX[2] < (ulong)in_RDX[1]) && (local_58 < 2)) {
      local_58 = 1;
    }
  }
  else {
    local_58 = 0xffffffffffffffc4;
  }
  return local_58;
}

Assistant:

size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx* mtctx,
                                     ZSTD_outBuffer* output,
                                     ZSTD_inBuffer* input,
                                     ZSTD_EndDirective endOp)
{
    unsigned forwardInputProgress = 0;
    DEBUGLOG(5, "ZSTDMT_compressStream_generic (endOp=%u, srcSize=%u)",
                (U32)endOp, (U32)(input->size - input->pos));
    assert(output->pos <= output->size);
    assert(input->pos  <= input->size);

    if ((mtctx->frameEnded) && (endOp==ZSTD_e_continue)) {
        /* current frame being ended. Only flush/end are allowed */
        return ERROR(stage_wrong);
    }

    /* fill input buffer */
    if ( (!mtctx->jobReady)
      && (input->size > input->pos) ) {   /* support NULL input */
        if (mtctx->inBuff.buffer.start == NULL) {
            assert(mtctx->inBuff.filled == 0); /* Can't fill an empty buffer */
            if (!ZSTDMT_tryGetInputRange(mtctx)) {
                /* It is only possible for this operation to fail if there are
                 * still compression jobs ongoing.
                 */
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange failed");
                assert(mtctx->doneJobID != mtctx->nextJobID);
            } else
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange completed successfully : mtctx->inBuff.buffer.start = %p", mtctx->inBuff.buffer.start);
        }
        if (mtctx->inBuff.buffer.start != NULL) {
            syncPoint_t const syncPoint = findSynchronizationPoint(mtctx, *input);
            if (syncPoint.flush && endOp == ZSTD_e_continue) {
                endOp = ZSTD_e_flush;
            }
            assert(mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize);
            DEBUGLOG(5, "ZSTDMT_compressStream_generic: adding %u bytes on top of %u to buffer of size %u",
                        (U32)syncPoint.toLoad, (U32)mtctx->inBuff.filled, (U32)mtctx->targetSectionSize);
            ZSTD_memcpy((char*)mtctx->inBuff.buffer.start + mtctx->inBuff.filled, (const char*)input->src + input->pos, syncPoint.toLoad);
            input->pos += syncPoint.toLoad;
            mtctx->inBuff.filled += syncPoint.toLoad;
            forwardInputProgress = syncPoint.toLoad>0;
        }
    }
    if ((input->pos < input->size) && (endOp == ZSTD_e_end)) {
        /* Can't end yet because the input is not fully consumed.
            * We are in one of these cases:
            * - mtctx->inBuff is NULL & empty: we couldn't get an input buffer so don't create a new job.
            * - We filled the input buffer: flush this job but don't end the frame.
            * - We hit a synchronization point: flush this job but don't end the frame.
            */
        assert(mtctx->inBuff.filled == 0 || mtctx->inBuff.filled == mtctx->targetSectionSize || mtctx->params.rsyncable);
        endOp = ZSTD_e_flush;
    }

    if ( (mtctx->jobReady)
      || (mtctx->inBuff.filled >= mtctx->targetSectionSize)  /* filled enough : let's compress */
      || ((endOp != ZSTD_e_continue) && (mtctx->inBuff.filled > 0))  /* something to flush : let's go */
      || ((endOp == ZSTD_e_end) && (!mtctx->frameEnded)) ) {   /* must finish the frame with a zero-size block */
        size_t const jobSize = mtctx->inBuff.filled;
        assert(mtctx->inBuff.filled <= mtctx->targetSectionSize);
        FORWARD_IF_ERROR( ZSTDMT_createCompressionJob(mtctx, jobSize, endOp) , "");
    }

    /* check for potential compressed data ready to be flushed */
    {   size_t const remainingToFlush = ZSTDMT_flushProduced(mtctx, output, !forwardInputProgress, endOp); /* block if there was no forward input progress */
        if (input->pos < input->size) return MAX(remainingToFlush, 1);  /* input not consumed : do not end flush yet */
        DEBUGLOG(5, "end of ZSTDMT_compressStream_generic: remainingToFlush = %u", (U32)remainingToFlush);
        return remainingToFlush;
    }
}